

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O1

int __thiscall SightCheck::init(SightCheck *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  sector_t_conflict *in_RCX;
  AActor *in_RDX;
  int iVar2;
  double *in_R8;
  int in_R9D;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = *(int *)((long)in_R8 + 0x1c);
  dVar3 = *(double *)(ctx + 0x58);
  dVar4 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  if (*(int *)(*(long *)(ctx + 0x130) + 0x208) != iVar1) {
    iVar2 = Displacements.size * iVar1 + *(int *)(*(long *)(ctx + 0x130) + 0x208);
    dVar5 = Displacements.data.Array[iVar2].pos.X;
    dVar6 = Displacements.data.Array[iVar2].pos.Y;
  }
  dVar6 = *(double *)(ctx + 0x50) + dVar6;
  dVar5 = *(double *)(ctx + 0x48) + dVar5;
  (this->sightstart).Z = dVar3;
  (this->sightstart).Y = dVar6;
  (this->sightstart).X = dVar5;
  iVar2 = in_RDX->Sector->PortalGroup;
  dVar7 = 0.0;
  if (iVar2 != iVar1) {
    iVar2 = iVar1 * Displacements.size + iVar2;
    dVar4 = Displacements.data.Array[iVar2].pos.X;
    dVar7 = Displacements.data.Array[iVar2].pos.Y;
  }
  dVar7 = (in_RDX->__Pos).Y + dVar7;
  dVar4 = (in_RDX->__Pos).X + dVar4;
  (this->sightend).Y = dVar7;
  (this->sightend).X = dVar4;
  dVar3 = dVar3 + *(double *)(ctx + 0x180) * 0.75;
  (this->sightstart).Z = dVar3;
  this->Startfrac = *in_R8;
  (this->Trace).x = dVar5;
  (this->Trace).y = dVar6;
  (this->Trace).dx = dVar4 - dVar5;
  (this->Trace).dy = dVar7 - dVar6;
  this->Lastzbottom = dVar3;
  this->Lastztop = dVar3;
  this->lastsector = in_RCX;
  this->seeingthing = in_RDX;
  this->topslope = in_R8[1];
  this->bottomslope = in_R8[2];
  this->Flags = in_R9D;
  iVar1 = *(int *)(in_R8 + 3);
  this->portaldir = iVar1;
  this->portalfound = false;
  this->myseethrough = 0x2000000;
  return iVar1;
}

Assistant:

void init(AActor * t1, AActor * t2, sector_t *startsector, SightTask *task, int flags)
	{
		sightstart = t1->PosRelative(task->portalgroup);
		sightend = t2->PosRelative(task->portalgroup);
		sightstart.Z += t1->Height * 0.75;

		Startfrac = task->Frac;
		Trace = { sightstart.X, sightstart.Y, sightend.X - sightstart.X, sightend.Y - sightstart.Y };
		Lastztop = Lastzbottom = sightstart.Z;
		lastsector = startsector;
		seeingthing=t2;
		topslope = task->topslope;
		bottomslope = task->bottomslope;
		Flags = flags;
		portaldir = task->direction;
		portalfound = false;

		myseethrough = FF_SEETHROUGH;
	}